

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O1

int Sim_ComputeSuppRound(Sim_Man_t *p,int fUseTargets)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  long *plVar5;
  void *pvVar6;
  Abc_Ntk_t *pAVar7;
  void *pvVar8;
  void **ppvVar9;
  int iVar10;
  int iVar11;
  Vec_Vec_t *pVVar12;
  Sim_Pat_t *pSVar13;
  void **ppvVar14;
  Vec_Ptr_t *pVVar15;
  long lVar16;
  int Fill;
  uint uVar17;
  long lVar18;
  long lVar19;
  long extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  ulong uVar20;
  ulong uVar21;
  timespec ts;
  int local_8c;
  timespec local_80;
  ulong local_70;
  ulong local_68;
  long local_60;
  int local_54;
  long local_50;
  Vec_Vec_t *local_48;
  uint local_3c;
  ulong local_38;
  
  local_54 = fUseTargets;
  iVar10 = clock_gettime(3,&local_80);
  if (iVar10 < 0) {
    lVar18 = 1;
  }
  else {
    lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
    lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + local_80.tv_sec * -1000000;
  }
  uVar20 = 0;
  Sim_UtilSimulate(p,0);
  iVar10 = clock_gettime(3,&local_80);
  if (iVar10 < 0) {
    lVar19 = -1;
  }
  else {
    lVar19 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
  }
  p->timeSim = p->timeSim + lVar19 + lVar18;
  local_70 = (ulong)p->iInput;
  if (p->iInput < p->nInputs) {
    uVar20 = 0;
    do {
      if ((local_54 == 0) || (*(int *)((long)p->vSuppTargs->pArray[local_70] + 4) != 0)) {
        iVar10 = clock_gettime(3,&local_80);
        if (iVar10 < 0) {
          lVar18 = 1;
        }
        else {
          lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
          lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + local_80.tv_sec * -1000000;
        }
        local_38 = uVar20;
        if (((long)local_70 < 0) ||
           (pVVar15 = p->pNtk->vCis, (long)pVVar15->nSize <= (long)local_70)) {
LAB_004cd8ed:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar4 = (Abc_Obj_t *)pVVar15->pArray[local_70];
        pVVar12 = Abc_DfsLevelized(pAVar4,0);
        iVar10 = clock_gettime(3,&local_80);
        if (iVar10 < 0) {
          lVar19 = -1;
        }
        else {
          lVar19 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
        }
        p->timeTrav = p->timeTrav + lVar19 + lVar18;
        Sim_UtilInfoFlip(p,pAVar4);
        lVar18 = extraout_RDX;
        local_48 = pVVar12;
        if (0 < pVVar12->nSize) {
          uVar20 = 0;
          do {
            if ((long)pVVar12->nSize <= (long)uVar20) {
LAB_004cd8af:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                            ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
            }
            lVar19 = 0;
            local_68 = uVar20;
            while (lVar19 < *(int *)((long)pVVar12->pArray[local_68] + 4)) {
              pAVar4 = *(Abc_Obj_t **)(*(long *)((long)pVVar12->pArray[local_68] + 8) + lVar19 * 8);
              plVar5 = (long *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
              lVar16 = *plVar5;
              iVar10 = (int)plVar5[2];
              local_60 = lVar19;
              Vec_IntFillExtra((Vec_Int_t *)(lVar16 + 0xe0),iVar10 + 1,(int)lVar18);
              if (((long)iVar10 < 0) || (*(int *)(lVar16 + 0xe4) <= iVar10)) goto LAB_004cd890;
              iVar2 = *(int *)(*(long *)(lVar16 + 0xe8) + (long)iVar10 * 4);
              iVar10 = *(int *)(*plVar5 + 0xd8);
              plVar5 = (long *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[1]];
              lVar18 = *plVar5;
              iVar11 = (int)plVar5[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar18 + 0xe0),iVar11 + 1,Fill);
              if (((long)iVar11 < 0) || (*(int *)(lVar18 + 0xe4) <= iVar11)) goto LAB_004cd890;
              local_50 = CONCAT71(local_50._1_7_,
                                  *(int *)(*(long *)(lVar18 + 0xe8) + (long)iVar11 * 4) ==
                                  *(int *)(*plVar5 + 0xd8));
              iVar11 = clock_gettime(3,&local_80);
              if (iVar11 < 0) {
                lVar19 = 1;
              }
              else {
                lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
                lVar19 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + local_80.tv_sec * -1000000;
              }
              Sim_UtilSimulateNode(p,pAVar4,1,(uint)(iVar2 == iVar10),(uint)(byte)local_50);
              iVar10 = clock_gettime(3,&local_80);
              if (iVar10 < 0) {
                lVar18 = -1;
              }
              else {
                lVar18 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
              }
              lVar18 = lVar18 + lVar19;
              p->timeSim = p->timeSim + lVar18;
              lVar19 = local_60 + 1;
              pVVar12 = local_48;
              if ((long)local_48->nSize <= (long)local_68) goto LAB_004cd8af;
            }
            uVar20 = local_68 + 1;
          } while ((long)uVar20 < (long)pVVar12->nSize);
        }
        if (local_54 == 0) {
          pVVar15 = p->pNtk->vCos;
          if (pVVar15->nSize < 1) goto LAB_004cd7e5;
          uVar17 = 1 << ((byte)local_70 & 0x1f);
          uVar20 = local_70 >> 5 & 0x7ffffff;
          lVar19 = 0;
          local_8c = 0;
          do {
            plVar5 = (long *)pVVar15->pArray[lVar19];
            lVar16 = *plVar5;
            iVar10 = (int)plVar5[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar16 + 0xe0),iVar10 + 1,(int)lVar18);
            if (((long)iVar10 < 0) || (*(int *)(lVar16 + 0xe4) <= iVar10)) goto LAB_004cd890;
            lVar18 = extraout_RDX_02;
            if ((*(int *)(*(long *)(lVar16 + 0xe8) + (long)iVar10 * 4) == *(int *)(*plVar5 + 0xd8))
               && (iVar10 = Sim_UtilInfoCompare(p,*(Abc_Obj_t **)
                                                   (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                                   (long)*(int *)plVar5[4] * 8)),
                  lVar18 = extraout_RDX_03, iVar10 == 0)) {
              pvVar6 = p->vSuppFun->pArray[lVar19];
              uVar3 = *(uint *)((long)pvVar6 + uVar20 * 4);
              if ((uVar3 & uVar17) == 0) {
                local_8c = local_8c + 1;
                *(uint *)((long)pvVar6 + uVar20 * 4) = uVar3 | uVar17;
              }
            }
            lVar19 = lVar19 + 1;
            pVVar15 = p->pNtk->vCos;
          } while (lVar19 < pVVar15->nSize);
        }
        else {
          pvVar6 = p->vSuppTargs->pArray[local_70];
          if ((long)*(int *)((long)pvVar6 + 4) < 1) {
LAB_004cd7e5:
            local_8c = 0;
          }
          else {
            uVar21 = local_70 >> 5 & 0x7ffffff;
            local_68 = CONCAT44(local_68._4_4_,1);
            local_3c = 1 << ((byte)local_70 & 0x1f);
            uVar20 = (ulong)local_3c;
            local_8c = 0;
            local_50 = (long)*(int *)((long)pvVar6 + 4);
            do {
              local_60 = local_50;
              uVar17 = (uint)*(undefined8 *)(*(long *)((long)pvVar6 + 8) + -8 + local_50 * 8);
              if (((int)uVar17 < 0) || (pVVar15 = p->pNtk->vCos, pVVar15->nSize <= (int)uVar17))
              goto LAB_004cd8ed;
              plVar5 = (long *)pVVar15->pArray[uVar17 & 0x7fffffff];
              pAVar4 = *(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8);
              pAVar7 = pAVar4->pNtk;
              iVar10 = pAVar4->Id;
              Vec_IntFillExtra(&pAVar7->vTravIds,iVar10 + 1,(int)uVar20);
              if (((long)iVar10 < 0) || ((pAVar7->vTravIds).nSize <= iVar10)) {
LAB_004cd890:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if ((pAVar7->vTravIds).pArray[iVar10] != pAVar4->pNtk->nTravIds) {
                __assert_fail("Abc_NodeIsTravIdCurrent(pNode)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                              ,0xf3,"int Sim_ComputeSuppRoundNode(Sim_Man_t *, int, int)");
              }
              lVar18 = local_60 + -1;
              iVar10 = Sim_UtilInfoCompare(p,pAVar4);
              uVar20 = extraout_RDX_00;
              local_50 = lVar18;
              if (iVar10 == 0) {
                uVar3 = *(uint *)((long)pvVar6 + 4);
                lVar19 = (ulong)uVar3 + 1;
                do {
                  if ((int)lVar19 + -1 < 1) {
                    __assert_fail("i >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                  ,0x318,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
                  }
                  lVar16 = lVar19 + -1;
                  lVar1 = lVar19 * 8;
                  lVar19 = lVar16;
                } while (*(long *)(*(long *)((long)pvVar6 + 8) + -0x10 + lVar1) !=
                         *(long *)(*(long *)((long)pvVar6 + 8) + lVar18 * 8));
                for (; (int)lVar16 < (int)uVar3; lVar16 = lVar16 + 1) {
                  *(undefined8 *)(*(long *)((long)pvVar6 + 8) + -8 + lVar16 * 8) =
                       *(undefined8 *)(*(long *)((long)pvVar6 + 8) + lVar16 * 8);
                }
                *(uint *)((long)pvVar6 + 4) = uVar3 - 1;
                pvVar8 = p->vSuppFun->pArray[uVar17 & 0x7fffffff];
                uVar3 = *(uint *)((long)pvVar8 + uVar21 * 4);
                if ((uVar3 & local_3c) != 0) {
                  __assert_fail("!Sim_SuppFunHasVar(p->vSuppFun, Output, iNumCi)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                                ,0xff,"int Sim_ComputeSuppRoundNode(Sim_Man_t *, int, int)");
                }
                local_8c = local_8c + 1;
                *(uint *)((long)pvVar8 + uVar21 * 4) = uVar3 | local_3c;
                Sim_UtilInfoDetectDiffs
                          ((uint *)p->vSim0->pArray[pAVar4->Id],(uint *)p->vSim1->pArray[pAVar4->Id]
                           ,p->nSimWords,p->vDiffs);
                uVar20 = extraout_RDX_01;
                if (((int)local_68 != 0) || (p->vFifo->nSize < 0x3e9)) {
                  if (p->vDiffs->nSize < 1) goto LAB_004cd6fc;
                  iVar10 = *p->vDiffs->pArray;
                  pSVar13 = Sim_ManPatAlloc(p);
                  pSVar13->Input = (int)local_70;
                  pSVar13->Output = uVar17;
                  pVVar15 = p->pNtk->vCis;
                  if (0 < pVVar15->nSize) {
                    ppvVar14 = pVVar15->pArray;
                    ppvVar9 = p->vSim0->pArray;
                    uVar20 = 0;
                    do {
                      if ((*(uint *)((long)ppvVar9[*(int *)((long)ppvVar14[uVar20] + 0x10)] +
                                    (long)(iVar10 >> 5) * 4) & 1 << ((byte)iVar10 & 0x1f)) != 0) {
                        pSVar13->pData[uVar20 >> 5 & 0x7ffffff] =
                             pSVar13->pData[uVar20 >> 5 & 0x7ffffff] | 1 << ((byte)uVar20 & 0x1f);
                      }
                      uVar20 = uVar20 + 1;
                    } while ((long)uVar20 < (long)pVVar15->nSize);
                  }
                  pVVar15 = p->vFifo;
                  uVar17 = pVVar15->nCap;
                  if (pVVar15->nSize == uVar17) {
                    if ((int)uVar17 < 0x10) {
                      if (pVVar15->pArray == (void **)0x0) {
                        ppvVar14 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar14 = (void **)realloc(pVVar15->pArray,0x80);
                      }
                      pVVar15->pArray = ppvVar14;
                      iVar10 = 0x10;
                    }
                    else {
                      iVar10 = uVar17 * 2;
                      if (iVar10 <= (int)uVar17) goto LAB_004cd6e2;
                      if (pVVar15->pArray == (void **)0x0) {
                        ppvVar14 = (void **)malloc((ulong)uVar17 << 4);
                      }
                      else {
                        ppvVar14 = (void **)realloc(pVVar15->pArray,(ulong)uVar17 << 4);
                      }
                      pVVar15->pArray = ppvVar14;
                    }
                    pVVar15->nCap = iVar10;
                  }
LAB_004cd6e2:
                  iVar10 = pVVar15->nSize;
                  uVar17 = iVar10 + 1;
                  uVar20 = (ulong)uVar17;
                  pVVar15->nSize = uVar17;
                  pVVar15->pArray[iVar10] = pSVar13;
                }
                local_68 = local_68 & 0xffffffff00000000;
              }
LAB_004cd6fc:
            } while (1 < local_60);
          }
        }
        pVVar12 = local_48;
        if (0 < local_48->nSize) {
          lVar18 = 0;
          do {
            pvVar6 = pVVar12->pArray[lVar18];
            if (pvVar6 != (void *)0x0) {
              if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar6 + 8));
                *(undefined8 *)((long)pvVar6 + 8) = 0;
              }
              free(pvVar6);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < pVVar12->nSize);
        }
        if (pVVar12->pArray != (void **)0x0) {
          free(pVVar12->pArray);
          pVVar12->pArray = (void **)0x0;
        }
        uVar20 = local_38;
        if (pVVar12 != (Vec_Vec_t *)0x0) {
          free(pVVar12);
        }
        uVar20 = (ulong)(uint)((int)uVar20 + local_8c);
      }
      local_70 = local_70 + 1;
    } while ((long)local_70 < (long)p->nInputs);
  }
  return (int)uVar20;
}

Assistant:

int Sim_ComputeSuppRound( Sim_Man_t * p, int  fUseTargets )
{
    Vec_Ptr_t * vTargets;
    int i, Counter = 0;
    abctime clk;
    // perform one round of random simulation
clk = Abc_Clock();
    Sim_UtilSimulate( p, 0 );
p->timeSim += Abc_Clock() - clk;
    // iterate through the CIs and detect COs that depend on them
    for ( i = p->iInput; i < p->nInputs; i++ )
    {
        vTargets = (Vec_Ptr_t *)p->vSuppTargs->pArray[i];
        if ( fUseTargets && vTargets->nSize == 0 )
            continue;
        Counter += Sim_ComputeSuppRoundNode( p, i, fUseTargets );
    }
    return Counter;
}